

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O1

void simulate_step(int64_t k,int32_t randomize_states_that_are_inputs)

{
  uint uVar1;
  Btor2Line *pBVar2;
  pointer pBVar3;
  _Bool _Var4;
  Type TVar5;
  uint32_t uVar6;
  long lVar7;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 aVar8;
  _Base_ptr p_Var9;
  long lVar10;
  BtorSimBitVector BVar11;
  char *__filename;
  int i;
  char *id;
  ulong uVar12;
  long lVar13;
  BtorSimState BVar14;
  BtorSimState s;
  undefined1 local_58 [8];
  anon_union_8_2_8be7de1a_for_BtorSimState_2 local_50;
  undefined1 local_40 [16];
  
  msg(1,"simulating step %ld",k);
  if (0 < num_format_lines) {
    id = (char *)0x0;
    do {
      __filename = id;
      lVar7 = btor2parser_get_line_by_id(model);
      if ((lVar7 != 0) &&
         ((0x2d < (ulong)*(uint *)(lVar7 + 0x18) ||
          ((0x200010424424U >> ((ulong)*(uint *)(lVar7 + 0x18) & 0x3f) & 1) == 0)))) {
        BVar14 = simulate((int64_t)id);
        local_50 = BVar14.field_1;
        local_58._0_4_ = BVar14.type;
        BtorSimState::remove((BtorSimState *)local_58,__filename);
      }
      id = id + 1;
    } while ((long)id < num_format_lines);
  }
  if (states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      pBVar2 = states.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12];
      if (nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
          super__Vector_impl_data._M_start[pBVar2->id] == (Btor2Line *)0x0) {
        if ((pBVar2->sort).tag == BTOR2_TAG_SORT_bitvec) {
          uVar6 = *(uint32_t *)&(pBVar2->sort).field_3;
          if (randomize_states_that_are_inputs == 0) {
            aVar8.bv_state = btorsim_bv_new(uVar6);
          }
          else {
            aVar8.bv_state = btorsim_bv_new_random(&rng,uVar6);
          }
          TVar5 = BITVEC;
        }
        else {
          lVar7 = btor2parser_get_line_by_id(model,(pBVar2->sort).field_3.array.index);
          lVar13 = btor2parser_get_line_by_id(model,(pBVar2->sort).field_3.array.element);
          aVar8.bv_state = (BtorSimBitVector *)operator_new(0x58);
          BVar11.len = 0;
          BVar11.width = *(uint *)(lVar7 + 0x38);
          uVar1 = *(uint *)(lVar13 + 0x38);
          *aVar8.bv_state = BVar11;
          (aVar8.array_state)->element_width = (ulong)uVar1;
          (aVar8.array_state)->random_seed = 0;
          (aVar8.array_state)->const_init = (BtorSimBitVector *)0x0;
          ((aVar8.array_state)->data)._M_h._M_buckets =
               &((aVar8.array_state)->data)._M_h._M_single_bucket;
          ((aVar8.array_state)->data)._M_h._M_bucket_count = 1;
          ((aVar8.array_state)->data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          ((aVar8.array_state)->data)._M_h._M_element_count = 0;
          ((aVar8.array_state)->data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          ((aVar8.array_state)->data)._M_h._M_rehash_policy._M_next_resize = 0;
          ((aVar8.array_state)->data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          TVar5 = ARRAY;
          if (randomize_states_that_are_inputs != 0) {
            uVar6 = btorsim_rng_rand(&rng);
            (aVar8.array_state)->random_seed = (ulong)uVar6;
          }
        }
      }
      else {
        BVar14 = simulate(nexts.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[pBVar2->id]->args[1]);
        aVar8 = BVar14.field_1;
        TVar5 = BVar14.type;
      }
      pBVar3 = next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = pBVar2->id;
      next_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7].type = TVar5;
      pBVar3[lVar7].field_1 = aVar8;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)states.
                                    super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)states.
                                    super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((constraints_violated < 0) &&
     (constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    uVar12 = 0;
    do {
      pBVar2 = constraints.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12];
      _Var4 = btorsim_bv_is_zero(current_state.
                                 super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                                 _M_impl.super__Vector_impl_data._M_start[*pBVar2->args].field_1.
                                 bv_state);
      if (_Var4) {
        msg(1,"constraint(%ld) \'%ld constraint %ld\' violated at time %ld",uVar12,pBVar2->id,
            *pBVar2->args,k);
        constraints_violated = k;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)constraints.
                                    super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)constraints.
                                    super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((constraints_violated < 0) &&
     (bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    uVar12 = 0;
    do {
      if (((reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12] < 0) &&
          (_Var4 = btorsim_bv_is_zero(current_state.
                                      super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [*bads.
                                        super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar12]->args].
                                      field_1.bv_state), !_Var4)) &&
         (reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] < 0)) {
        reached_bads.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar12] = k;
        num_unreached_bads = num_unreached_bads + -1;
        if (num_unreached_bads == 0) {
          msg(1,"all %ld bad state properties reached",
              (long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)bads.super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3);
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)bads.
                                    super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)bads.
                                    super__Vector_base<Btor2Line_*,_std::allocator<Btor2Line_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((_Rb_tree_header *)
      extra_constraints_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &extra_constraints_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    p_Var9 = extra_constraints_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_58 = *(undefined1 (*) [8])(p_Var9 + 1);
      local_50.bv_state = (BtorSimBitVector *)local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_58 + 8),p_Var9[1]._M_parent,
                 (long)&(p_Var9[1]._M_parent)->_M_color + (long)&(p_Var9[1]._M_left)->_M_color);
      _Var4 = btorsim_bv_is_zero(current_state.
                                 super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                                 _M_impl.super__Vector_impl_data._M_start[(long)local_58].field_1.
                                 bv_state);
      if (!_Var4) {
        printf("[btorsim] Assert failed in test: %s (step %ld)\n",local_50.bv_state,k);
      }
      if (local_50.bv_state != (BtorSimBitVector *)local_40) {
        operator_delete(local_50.bv_state);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 !=
             &extra_constraints_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
  }
  if ((dump_vcd == '\x01') && (0 < num_format_lines)) {
    lVar13 = 8;
    lVar7 = 0;
    do {
      lVar10 = btor2parser_get_line_by_id(model,lVar7);
      if (((lVar10 != 0) &&
          ((0x2d < (ulong)*(uint *)(lVar10 + 0x18) ||
           ((0x200000424424U >> ((ulong)*(uint *)(lVar10 + 0x18) & 0x3f) & 1) == 0)))) &&
         (*(long *)(lVar10 + 0x60) != 0)) {
        BVar14._4_4_ = 0;
        BVar14.type = *(uint *)((long)current_state.
                                      super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8);
        BVar14.field_1.bv_state =
             ((anon_union_8_2_8be7de1a_for_BtorSimState_2 *)
             ((long)&(current_state.super__Vector_base<BtorSimState,_std::allocator<BtorSimState>_>.
                      _M_impl.super__Vector_impl_data._M_start)->type + lVar13))->bv_state;
        BtorSimVCDWriter::add_value_change(vcd_writer,k,lVar7,BVar14);
      }
      lVar7 = lVar7 + 1;
      lVar13 = lVar13 + 0x10;
    } while (lVar7 < num_format_lines);
  }
  return;
}

Assistant:

static void
simulate_step (int64_t k, int32_t randomize_states_that_are_inputs)
{
  msg (1, "simulating step %" PRId64, k);
  for (int64_t i = 0; i < num_format_lines; i++)
  {
    Btor2Line *l = btor2parser_get_line_by_id (model, i);
    if (!l) continue;
    if (l->tag == BTOR2_TAG_sort || l->tag == BTOR2_TAG_init
        || l->tag == BTOR2_TAG_next || l->tag == BTOR2_TAG_bad
        || l->tag == BTOR2_TAG_constraint || l->tag == BTOR2_TAG_fair
        || l->tag == BTOR2_TAG_justice || l->tag == BTOR2_TAG_output)
      continue;

    BtorSimState s = simulate (i);
#if 0
    printf ("[btorim] %" PRId64 " %s ", l->id, l->name);
    if(s.type == BtorSimState::Type::BITVEC) btorsim_bv_print (s.bv_state);
    fflush (stdout);
#endif
    s.remove ();
  }
  for (size_t i = 0; i < states.size (); i++)
  {
    Btor2Line *state = states[i];
    assert (0 <= state->id), assert (state->id < num_format_lines);
    Btor2Line *next = nexts[state->id];
    BtorSimState update;
    if (next)
    {
      assert (next->nargs == 2);
      assert (next->args[0] == state->id);
      update = simulate (next->args[1]);
    }
    else
    {
      if (state->sort.tag == BTOR2_TAG_SORT_bitvec)
      {
        update.type    = BtorSimState::Type::BITVEC;
        uint32_t width = state->sort.bitvec.width;
        if (randomize_states_that_are_inputs)
          update.bv_state = btorsim_bv_new_random (&rng, width);
        else
          update.bv_state = btorsim_bv_new (width);
      }
      else
      {
        assert (state->sort.tag == BTOR2_TAG_SORT_array);
        update.type = BtorSimState::Type::ARRAY;
        Btor2Line *li =
            btor2parser_get_line_by_id (model, state->sort.array.index);
        Btor2Line *le =
            btor2parser_get_line_by_id (model, state->sort.array.element);
        assert (li->sort.tag == BTOR2_TAG_SORT_bitvec);
        assert (le->sort.tag == BTOR2_TAG_SORT_bitvec);
        update.array_state = new BtorSimArrayModel (li->sort.bitvec.width,
                                                    le->sort.bitvec.width);
        if (randomize_states_that_are_inputs)
          update.array_state->random_seed = btorsim_rng_rand (&rng);
      }
    }
    assert (!next_state[state->id].is_set ());
    assert (next_state[state->id].type == update.type);
    next_state[state->id] = update;
  }

  if (constraints_violated < 0)
  {
    for (size_t i = 0; i < constraints.size (); i++)
    {
      Btor2Line *constraint = constraints[i];
      BtorSimState s        = current_state[constraint->args[0]];
      assert (s.type == BtorSimState::Type::BITVEC);
      if (!btorsim_bv_is_zero (s.bv_state)) continue;
      msg (1,
           "constraint(%" PRId64 ") '%" PRId64 " constraint %" PRId64
           "' violated at time %" PRId64,
           i,
           constraint->id,
           constraint->args[0],
           k);
      constraints_violated = k;
    }
  }

  if (constraints_violated < 0)
  {
    for (size_t i = 0; i < bads.size (); i++)
    {
      int64_t r = reached_bads[i];
      if (r >= 0) continue;
      Btor2Line *bad = bads[i];
      BtorSimState s = current_state[bad->args[0]];
      assert (s.type == BtorSimState::Type::BITVEC);
      if (btorsim_bv_is_zero (s.bv_state)) continue;
      int64_t bound = reached_bads[i];
      if (bound >= 0) continue;
      reached_bads[i] = k;
      assert (num_unreached_bads > 0);
      if (!--num_unreached_bads)
        msg (1,
             "all %" PRId64 " bad state properties reached",
             (int64_t) bads.size ());
    }
  }

  /* Check additional bads from info file */
  for (auto it : extra_constraints)
  {
    BtorSimState s = current_state[it.first];
    assert (s.type == BtorSimState::Type::BITVEC);
    if (btorsim_bv_is_zero (s.bv_state)) continue;
    printf ("[btorsim] Assert failed in test: %s (step %" PRId64 ")\n",
            it.second.c_str (),
            k);
  }

  if (dump_vcd)
  {
    for (int i = 0; i < num_format_lines; i++)
    {
      Btor2Line *l = btor2parser_get_line_by_id (model, i);
      if (!l) continue;
      // these are not signals
      if (l->tag == BTOR2_TAG_sort || l->tag == BTOR2_TAG_init
          || l->tag == BTOR2_TAG_next || l->tag == BTOR2_TAG_bad
          || l->tag == BTOR2_TAG_constraint || l->tag == BTOR2_TAG_fair
          || l->tag == BTOR2_TAG_justice)
        continue;
      // only add named signals
      if (!l->symbol) continue;
      vcd_writer->add_value_change (k, i, current_state[i]);
    }
  }
}